

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O3

_Bool fs_stdio_update_entry(ALLEGRO_FS_ENTRY *fp)

{
  ALLEGRO_FS_INTERFACE *pAVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  ALLEGRO_FS_INTERFACE *pAVar5;
  uint uVar6;
  
  iVar2 = stat((char *)fp[1].vtable,(stat *)(fp + 3));
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    al_set_errno(*piVar4);
  }
  else {
    pAVar1 = fp[6].vtable;
    uVar6 = ((uint)(((ulong)pAVar1 & 0x120) != 0) | (uint)(((ulong)pAVar1 & 0xf000) == 0x4000) << 4)
            + (uint)(((ulong)pAVar1 & 0x90) != 0) * 2 + (uint)(((ulong)pAVar1 & 0x48) != 0) * 4 +
            0x10;
    *(uint *)&fp[2].vtable = uVar6;
    pAVar1 = fp[1].vtable;
    pcVar3 = strrchr((char *)pAVar1,0x2f);
    pAVar5 = (ALLEGRO_FS_INTERFACE *)(pcVar3 + 1);
    if (pcVar3 == (char *)0x0) {
      pAVar5 = pAVar1;
    }
    if (*(char *)&pAVar5->fs_create_entry == '.') {
      *(uint *)&fp[2].vtable = uVar6 | 8;
    }
  }
  return iVar2 != -1;
}

Assistant:

static bool fs_stdio_update_entry(ALLEGRO_FS_ENTRY *fp)
{
   ALLEGRO_FS_ENTRY_STDIO *fp_stdio = (ALLEGRO_FS_ENTRY_STDIO *) fp;
   int ret;

   ret = WRAP_STAT(fp_stdio->abs_path, &(fp_stdio->st));
   if (ret == -1) {
      al_set_errno(errno);
      return false;
   }

   fs_update_stat_mode(fp_stdio);

   return true;
}